

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * ghc::filesystem::absolute(path *p,error_code *ec)

{
  bool bVar1;
  undefined1 uVar2;
  error_code *in_RDX;
  path *in_RDI;
  error_code eVar3;
  path base;
  path *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  undefined4 uStack_134;
  path *in_stack_fffffffffffffed0;
  path *in_stack_fffffffffffffed8;
  path *in_stack_fffffffffffffef8;
  error_code *in_stack_ffffffffffffff08;
  
  std::error_code::clear
            ((error_code *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,
                               CONCAT15(in_stack_fffffffffffffeb5,
                                        CONCAT14(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0
                                                )))));
  current_path(in_stack_ffffffffffffff08);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    eVar3 = detail::make_system_error
                      (CONCAT13(in_stack_fffffffffffffeb7,
                                CONCAT12(in_stack_fffffffffffffeb6,
                                         CONCAT11(in_stack_fffffffffffffeb5,
                                                  in_stack_fffffffffffffeb4))));
    *(ulong *)in_RDX = CONCAT44(uStack_134,eVar3._M_value);
    in_RDX->_M_cat = eVar3._M_cat;
    path::path((path *)0x130918);
  }
  else {
    bVar1 = path::empty((path *)0x1305a0);
    if (bVar1) {
      operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    }
    else {
      uVar2 = path::has_root_name((path *)0x1305f8);
      if ((bool)uVar2) {
        bVar1 = path::has_root_directory(in_RDI);
        if (bVar1) {
          path::path((path *)CONCAT17(uVar2,CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffffeb5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffeb4,
                                                  in_stack_fffffffffffffeb0)))),
                     in_stack_fffffffffffffea8);
        }
        else {
          path::root_name(in_stack_fffffffffffffef8);
          path::root_directory(in_stack_fffffffffffffef8);
          operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          path::relative_path((path *)in_stack_ffffffffffffff08);
          operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          path::relative_path((path *)in_stack_ffffffffffffff08);
          operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          path::~path((path *)0x130700);
          path::~path((path *)0x13070d);
          path::~path((path *)0x130717);
          path::~path((path *)0x130724);
          path::~path((path *)0x130731);
          path::~path((path *)0x13073e);
        }
      }
      else {
        bVar1 = path::has_root_directory(in_RDI);
        if (bVar1) {
          path::root_name(in_stack_fffffffffffffef8);
          operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
          path::~path((path *)0x130877);
        }
        else {
          operator/(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        }
      }
    }
  }
  path::~path((path *)0x130930);
  return in_RDI;
}

Assistant:

GHC_INLINE path absolute(const path& p, std::error_code& ec)
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (p.empty()) {
        return absolute(current_path(ec), ec) / "";
    }
    ULONG size = ::GetFullPathNameW(GHC_NATIVEWP(p), 0, 0, 0);
    if (size) {
        std::vector<wchar_t> buf(size, 0);
        ULONG s2 = GetFullPathNameW(GHC_NATIVEWP(p), size, buf.data(), nullptr);
        if (s2 && s2 < size) {
            path result = path(std::wstring(buf.data(), s2));
            if (p.filename() == ".") {
                result /= ".";
            }
            return result;
        }
    }
    ec = detail::make_system_error();
    return path();
#else
    path base = current_path(ec);
    if (!ec) {
        if (p.empty()) {
            return base / p;
        }
        if (p.has_root_name()) {
            if (p.has_root_directory()) {
                return p;
            }
            else {
                return p.root_name() / base.root_directory() / base.relative_path() / p.relative_path();
            }
        }
        else {
            if (p.has_root_directory()) {
                return base.root_name() / p;
            }
            else {
                return base / p;
            }
        }
    }
    ec = detail::make_system_error();
    return path();
#endif
}